

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Form.cpp
# Opt level: O3

void __thiscall curlpp::FormParts::File::File(File *this,string *name,string *filename)

{
  pointer pcVar1;
  
  (this->super_FormPart)._vptr_FormPart = (_func_int **)&PTR__FormPart_00133b70;
  (this->super_FormPart).mName._M_dataplus._M_p = (pointer)&(this->super_FormPart).mName.field_2;
  pcVar1 = (name->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&(this->super_FormPart).mName,pcVar1,pcVar1 + name->_M_string_length);
  (this->super_FormPart)._vptr_FormPart = (_func_int **)&PTR__File_00133ba0;
  (this->mFilename)._M_dataplus._M_p = (pointer)&(this->mFilename).field_2;
  pcVar1 = (filename->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&this->mFilename,pcVar1,pcVar1 + filename->_M_string_length);
  (this->mContentType)._M_dataplus._M_p = (pointer)&(this->mContentType).field_2;
  (this->mContentType)._M_string_length = 0;
  (this->mContentType).field_2._M_local_buf[0] = '\0';
  return;
}

Assistant:

curlpp::FormParts::File::File(const std::string & name, 
			      const std::string & filename)
  : FormPart(name)
  , mFilename(filename)
{}